

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O1

void __thiscall kratos::InsertSyncReset::InsertSyncReset(InsertSyncReset *this,Generator *gen)

{
  string *delimiter;
  pointer psVar1;
  element_type *peVar2;
  pointer pcVar3;
  int iVar4;
  string *line;
  pointer psVar5;
  bool bVar6;
  undefined1 local_f0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  token_values_1;
  undefined1 local_b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  token_values;
  undefined1 local_78 [8];
  value_type first_token;
  value_type var_name;
  
  (this->super_IRVisitor).level = 0;
  (this->super_IRVisitor).visited_._M_h._M_buckets =
       &(this->super_IRVisitor).visited_._M_h._M_single_bucket;
  (this->super_IRVisitor).visited_._M_h._M_bucket_count = 1;
  (this->super_IRVisitor).visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_IRVisitor).visited_._M_h._M_element_count = 0;
  (this->super_IRVisitor).visited_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_IRVisitor).visited_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_IRVisitor).visited_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002d3108;
  this->run_pass_ = false;
  this->over_clk_en_ = false;
  (this->reset_name_)._M_dataplus._M_p = (pointer)&(this->reset_name_).field_2;
  (this->reset_name_)._M_string_length = 0;
  (this->reset_name_).field_2._M_local_buf[0] = '\0';
  (this->sync_reset_name)._M_dataplus._M_p = (pointer)&(this->sync_reset_name).field_2;
  var_name.field_2._8_8_ = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->sync_reset_name,"sync-reset","");
  psVar5 = (gen->super_IRNode).attributes_.
           super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (gen->super_IRNode).attributes_.
           super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 != psVar1) {
    delimiter = (string *)(&first_token.field_2._M_allocated_capacity + 1);
    do {
      peVar2 = (psVar5->super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (*(ulong *)(var_name.field_2._8_8_ + 0x78) < (peVar2->value_str)._M_string_length) {
        line = &peVar2->value_str;
        std::__cxx11::string::substr((ulong)local_78,(ulong)line);
        if (first_token._M_dataplus._M_p == *(pointer *)(var_name.field_2._8_8_ + 0x78)) {
          if (first_token._M_dataplus._M_p == (pointer)0x0) {
            bVar6 = true;
          }
          else {
            iVar4 = bcmp((void *)local_78,(this->sync_reset_name)._M_dataplus._M_p,
                         (size_t)first_token._M_dataplus._M_p);
            bVar6 = iVar4 == 0;
          }
        }
        else {
          bVar6 = false;
        }
        if (local_78 != (undefined1  [8])&first_token._M_string_length) {
          operator_delete((void *)local_78,first_token._M_string_length + 1);
        }
        if (bVar6) {
          local_78 = (undefined1  [8])&first_token._M_string_length;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_78,";","");
          string::get_tokens((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_f0,line,(string *)local_78);
          if (local_78 != (undefined1  [8])&first_token._M_string_length) {
            operator_delete((void *)local_78,first_token._M_string_length + 1);
          }
          local_78 = (undefined1  [8])&first_token._M_string_length;
          pcVar3 = ((_Alloc_hider *)local_f0)->_M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_78,pcVar3,pcVar3 + *(size_type *)((long)local_f0 + 8));
          first_token.field_2._8_8_ = &var_name._M_string_length;
          std::__cxx11::string::_M_construct<char_const*>((string *)delimiter,"=","");
          string::get_tokens((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_b8,(string *)local_78,delimiter);
          if ((size_type *)first_token.field_2._8_8_ != &var_name._M_string_length) {
            operator_delete((void *)first_token.field_2._8_8_,var_name._M_string_length + 1);
          }
          if ((long)token_values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)local_b8 == 0x40) {
            first_token.field_2._8_8_ = &var_name._M_string_length;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)delimiter,*(long *)((long)local_b8 + 0x20),
                       *(long *)((long)local_b8 + 0x28) + *(long *)((long)local_b8 + 0x20));
            bVar6 = is_valid_variable_name(delimiter);
            if (bVar6) {
              *(undefined1 *)(var_name.field_2._8_8_ + 0x48) = 1;
              std::__cxx11::string::_M_assign((string *)&this->reset_name_);
            }
            if ((size_type *)first_token.field_2._8_8_ != &var_name._M_string_length) {
              operator_delete((void *)first_token.field_2._8_8_,var_name._M_string_length + 1);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_b8);
          if ((long)tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)local_f0 == 0x40) {
            first_token.field_2._8_8_ = &var_name._M_string_length;
            pcVar3 = (((pointer)((long)local_f0 + 0x20))->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)delimiter,pcVar3,
                       pcVar3 + ((pointer)((long)local_f0 + 0x20))->_M_string_length);
            local_b8 = (undefined1  [8])
                       &token_values.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"=","");
            string::get_tokens((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&tokens.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,delimiter,
                               (string *)local_b8);
            if (local_b8 !=
                (undefined1  [8])
                &token_values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
              operator_delete((void *)local_b8,
                              (ulong)((long)&((token_values.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish)->
                                             _M_dataplus)._M_p + 1));
            }
            if ((long)token_values_1.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start -
                (long)tokens.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage == 0x40) {
              iVar4 = std::__cxx11::string::compare
                                ((char *)tokens.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (iVar4 == 0) {
                iVar4 = std::__cxx11::string::compare
                                  ((char *)(tokens.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1))
                ;
                if (iVar4 != 0) {
                  iVar4 = std::__cxx11::string::compare
                                    ((char *)(tokens.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1
                                             ));
                  if (iVar4 != 0) goto LAB_0020674b;
                }
                *(undefined1 *)(var_name.field_2._8_8_ + 0x49) = 1;
              }
            }
LAB_0020674b:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&tokens.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if ((size_type *)first_token.field_2._8_8_ != &var_name._M_string_length) {
              operator_delete((void *)first_token.field_2._8_8_,var_name._M_string_length + 1);
            }
          }
          if (local_78 != (undefined1  [8])&first_token._M_string_length) {
            operator_delete((void *)local_78,first_token._M_string_length + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_f0);
        }
      }
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar1);
  }
  return;
}

Assistant:

explicit InsertSyncReset(Generator* gen) {
        auto const& attributes = gen->get_attributes();
        for (auto const& attr : attributes) {
            auto const& value = attr->value_str;
            if (value.size() > sync_reset_name.size()) {
                if (value.substr(0, sync_reset_name.size()) == sync_reset_name) {
                    // get reset_name
                    auto tokens = string::get_tokens(value, ";");
                    auto first_token = tokens[0];
                    {
                        auto token_values = string::get_tokens(first_token, "=");
                        if (token_values.size() == 2) {
                            auto var_name = token_values[1];
                            if (is_valid_variable_name(var_name)) {
                                run_pass_ = true;
                                reset_name_ = var_name;
                            }
                        }
                    }
                    if (tokens.size() == 2) {
                        auto param_value = tokens[1];
                        auto token_values = string::get_tokens(param_value, "=");
                        if (token_values.size() == 2 && token_values[0] == "over_clk_en") {
                            if (token_values[1] == "true" || token_values[1] == "1") {
                                over_clk_en_ = true;
                            }
                        }
                    }
                }
            }
        }
    }